

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O0

int lws_pvo_get_str(void *in,char *name,char **result)

{
  lws_protocol_vhost_options *plVar1;
  lws_protocol_vhost_options *pv;
  char **result_local;
  char *name_local;
  void *in_local;
  
  plVar1 = lws_pvo_search((lws_protocol_vhost_options *)in,name);
  if (plVar1 != (lws_protocol_vhost_options *)0x0) {
    *result = plVar1->value;
  }
  in_local._4_4_ = (uint)(plVar1 == (lws_protocol_vhost_options *)0x0);
  return in_local._4_4_;
}

Assistant:

int
lws_pvo_get_str(void *in, const char *name, const char **result)
{
	const struct lws_protocol_vhost_options *pv =
		lws_pvo_search((const struct lws_protocol_vhost_options *)in,
				name);

	if (!pv)
		return 1;

	*result = (const char *)pv->value;

	return 0;
}